

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O2

void build_eq(Grammar *g)

{
  State *pSVar1;
  State *pSVar2;
  State *pSVar3;
  State *pSVar4;
  State *pSVar5;
  Rule *pRVar6;
  Rule *pRVar7;
  uint *puVar8;
  uint *puVar9;
  bool bVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  void *__ptr;
  ulong uVar14;
  ulong uVar15;
  long *plVar16;
  void *pvVar17;
  long lVar18;
  long *plVar19;
  long lVar20;
  ulong uVar21;
  
  uVar21 = (ulong)(g->states).n;
  __ptr = calloc(1,uVar21 * 0x18);
  bVar10 = true;
  while (bVar10) {
    uVar14 = 0;
    bVar10 = false;
    while (uVar14 < uVar21) {
      pSVar1 = (g->states).v[uVar14];
      plVar19 = (long *)((ulong)pSVar1->index * 0x18 + (long)__ptr);
      uVar14 = uVar14 + 1;
      for (uVar15 = uVar14 & 0xffffffff; (uint)uVar15 < (uint)uVar21;
          uVar15 = (ulong)((uint)uVar15 + 1)) {
        if (*plVar19 == 0) {
          pSVar2 = (g->states).v[uVar15];
          plVar16 = (long *)((ulong)pSVar2->index * 0x18 + (long)__ptr);
          if ((*plVar16 == 0) &&
             (((pSVar1->same_shifts == pSVar2->same_shifts || (pSVar2->same_shifts == pSVar1)) &&
              (uVar11 = (pSVar1->gotos).n, uVar11 == (pSVar2->gotos).n)))) {
            for (uVar21 = 0; uVar21 < uVar11; uVar21 = uVar21 + 1) {
              uVar12 = elem_symbol(g,(pSVar1->gotos).v[uVar21]->elem);
              uVar13 = elem_symbol(g,(pSVar2->gotos).v[uVar21]->elem);
              if (uVar12 != uVar13) goto LAB_00139b28;
              pSVar3 = (pSVar1->gotos).v[uVar21]->state;
              pSVar4 = (pSVar2->gotos).v[uVar21]->state;
              if (pSVar3 != pSVar4) {
                pSVar5 = *(State **)((long)__ptr + (ulong)pSVar3->index * 0x18);
                if ((((pSVar5 != pSVar4) &&
                     (*(State **)((long)__ptr + (ulong)pSVar4->index * 0x18) != pSVar3)) ||
                    ((plVar16[2] != 0 &&
                     (plVar16[2] != *(long *)((long)__ptr + (ulong)pSVar4->index * 0x18))))) ||
                   (((State *)plVar19[2] != (State *)0x0 && ((State *)plVar19[2] != pSVar5))))
                goto LAB_00139b28;
                plVar16[2] = (long)pSVar4;
                plVar19[2] = (long)pSVar3;
              }
              uVar11 = (pSVar1->gotos).n;
            }
            uVar11 = (pSVar1->reduce_actions).n;
            if (uVar11 == (pSVar2->reduce_actions).n) {
              for (uVar21 = 0; uVar11 != uVar21; uVar21 = uVar21 + 1) {
                pRVar6 = (pSVar1->reduce_actions).v[uVar21]->rule;
                pRVar7 = (pSVar2->reduce_actions).v[uVar21]->rule;
                if (pRVar6 != pRVar7) {
                  if (pRVar6->prod != pRVar7->prod) goto LAB_00139b28;
                  if ((pRVar6->elems).n != (pRVar7->elems).n) {
                    if ((((Rule *)plVar16[1] != (Rule *)0x0) && ((Rule *)plVar16[1] != pRVar7)) ||
                       (((Rule *)plVar19[1] != (Rule *)0x0 && ((Rule *)plVar19[1] != pRVar6))))
                    goto LAB_00139b28;
                    plVar16[1] = (long)pRVar7;
                    plVar19[1] = (long)pRVar6;
                  }
                }
              }
              *plVar16 = (long)pSVar1;
              bVar10 = true;
            }
          }
        }
LAB_00139b28:
        uVar21 = (ulong)(g->states).n;
      }
    }
  }
  for (uVar14 = 0; uVar14 < uVar21; uVar14 = uVar14 + 1) {
    uVar15 = (ulong)(g->states).v[uVar14]->index;
    lVar20 = uVar15 * 0x18;
    puVar8 = *(uint **)((long)__ptr + lVar20);
    if ((puVar8 != (uint *)0x0) && (2 < d_verbose_level)) {
      printf("eq %d %d ",uVar15,(ulong)*puVar8);
      puVar9 = *(uint **)((long)__ptr + lVar20 + 0x10);
      if (puVar9 != (uint *)0x0) {
        printf("diff state (%d %d) ",(ulong)*puVar9,
               (ulong)**(uint **)((long)__ptr + (ulong)*puVar8 * 0x18 + 0x10));
      }
      pRVar6 = *(Rule **)((long)__ptr + lVar20 + 8);
      if (pRVar6 != (Rule *)0x0) {
        printf("diff rule ");
        printf("[ ");
        print_rule(pRVar6);
        printf("][ ");
        print_rule(*(Rule **)((long)__ptr + (ulong)*puVar8 * 0x18 + 8));
        putchar(0x5d);
      }
      putchar(10);
      uVar21 = (ulong)(g->states).n;
    }
  }
  uVar14 = 0;
  do {
    if (uVar21 == uVar14) {
      for (uVar14 = 0; uVar14 < uVar21; uVar14 = uVar14 + 1) {
        pSVar1 = (g->states).v[uVar14];
        pSVar2 = pSVar1->reduces_to;
        if ((pSVar2 != (State *)0x0) && (d_verbose_level != 0)) {
          printf("reduces_to %d %d\n",(ulong)pSVar1->index,(ulong)pSVar2->index);
          uVar21 = (ulong)(g->states).n;
        }
      }
      free(__ptr);
      return;
    }
    pSVar1 = (g->states).v[uVar14];
    lVar20 = (ulong)pSVar1->index * 0x18;
    pSVar2 = *(State **)((long)__ptr + lVar20);
    if (pSVar2 != (State *)0x0) {
      pvVar17 = (void *)(lVar20 + (long)__ptr);
      if (*(uint **)((long)pvVar17 + 0x10) != (uint *)0x0) {
        lVar20 = *(long *)((long)__ptr + (ulong)**(uint **)((long)pvVar17 + 0x10) * 0x18 + 8);
        if ((lVar20 == 0) || (*(int *)(lVar20 + 0x20) != 2)) {
          lVar18 = (ulong)pSVar2->index * 0x18;
          lVar20 = *(long *)((long)__ptr +
                            (ulong)**(uint **)((long)__ptr + lVar18 + 0x10) * 0x18 + 8);
          if ((lVar20 == 0) || (*(int *)(lVar20 + 0x20) != 2)) goto LAB_00139ce2;
          pSVar2->reduces_to = pSVar1;
          pSVar1->reduces_with = *(Rule **)((long)pvVar17 + 8);
          pvVar17 = (void *)((long)__ptr + lVar18);
        }
        else {
          pSVar1->reduces_to = pSVar2;
          pSVar1->reduces_with = *(Rule **)((long)__ptr + (ulong)pSVar2->index * 0x18 + 8);
        }
        pSVar1->reduces_to_then_with = *(Rule **)((long)pvVar17 + 8);
      }
    }
LAB_00139ce2:
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

void build_eq(Grammar *g) {
  uint i, j, k, changed = 1, x, xx;
  State *s, *ss;
  EqState *eq, *e, *ee;

  eq = (EqState *)MALLOC(sizeof(EqState) * g->states.n);
  memset(eq, 0, sizeof(EqState) * g->states.n);
  while (changed) {
    changed = 0;
    for (i = 0; i < g->states.n; i++) {
      s = g->states.v[i];
      e = &eq[s->index];
      for (j = i + 1; j < g->states.n; j++) {
        ss = g->states.v[j];
        ee = &eq[ss->index];
        if (e->eq || ee->eq) continue;
        if (s->same_shifts != ss->same_shifts && ss->same_shifts != s) continue;
        /* check gotos */
        if (s->gotos.n != ss->gotos.n) continue;
        for (k = 0; k < s->gotos.n; k++) {
          if (elem_symbol(g, s->gotos.v[k]->elem) != elem_symbol(g, ss->gotos.v[k]->elem)) goto Lcontinue;
          if (s->gotos.v[k]->state != ss->gotos.v[k]->state) {
            EqState *ge = &eq[s->gotos.v[k]->state->index];
            EqState *gee = &eq[ss->gotos.v[k]->state->index];
            if (ge->eq != ss->gotos.v[k]->state && gee->eq != s->gotos.v[k]->state) goto Lcontinue;
            if ((ee->diff_state && ee->diff_state != eq[ss->gotos.v[k]->state->index].eq) ||
                (e->diff_state && e->diff_state != eq[s->gotos.v[k]->state->index].eq))
              goto Lcontinue;
            /* allow one different state */
            ee->diff_state = ss->gotos.v[k]->state;
            e->diff_state = s->gotos.v[k]->state;
          }
        }
        /* check reductions */
        if (s->reduce_actions.n != ss->reduce_actions.n) continue;
        for (k = 0; k < s->reduce_actions.n; k++) {
          if (s->reduce_actions.v[k]->rule == ss->reduce_actions.v[k]->rule) continue;
          if (s->reduce_actions.v[k]->rule->prod != ss->reduce_actions.v[k]->rule->prod) goto Lcontinue;
          if ((x = s->reduce_actions.v[k]->rule->elems.n) != (xx = ss->reduce_actions.v[k]->rule->elems.n)) {
            if ((ee->diff_rule && ee->diff_rule != ss->reduce_actions.v[k]->rule) ||
                (e->diff_rule && e->diff_rule != s->reduce_actions.v[k]->rule))
              goto Lcontinue;
            /* allow one different rule */
            ee->diff_rule = ss->reduce_actions.v[k]->rule;
            e->diff_rule = s->reduce_actions.v[k]->rule;
          }
        }
        ee->eq = s;
        changed = 1;
      Lcontinue:;
      }
    }
  }
  for (i = 0; i < g->states.n; i++) {
    s = g->states.v[i];
    e = &eq[s->index];
    if (e->eq) {
      if (d_verbose_level > 2) {
        printf("eq %d %d ", s->index, e->eq->index);
        if (e->diff_state) printf("diff state (%d %d) ", e->diff_state->index, eq[e->eq->index].diff_state->index);
        if (e->diff_rule) {
          printf("diff rule ");
          printf("[ ");
          print_rule(e->diff_rule);
          printf("][ ");
          print_rule(eq[e->eq->index].diff_rule);
          printf("]");
        }
        printf("\n");
      }
    }
  }
  for (i = 0; i < g->states.n; i++) {
    s = g->states.v[i];
    e = &eq[s->index];
    if (e->eq && e->diff_state) {
      if (eq[e->diff_state->index].diff_rule && eq[e->diff_state->index].diff_rule->elems.n == 2) {
        s->reduces_to = e->eq;
        s->reduces_with = eq[e->eq->index].diff_rule;
        s->reduces_to_then_with = e->diff_rule;
      } else if (eq[eq[e->eq->index].diff_state->index].diff_rule &&
                 eq[eq[e->eq->index].diff_state->index].diff_rule->elems.n == 2) {
        e->eq->reduces_to = s;
        s->reduces_with = e->diff_rule;
        s->reduces_to_then_with = eq[e->eq->index].diff_rule;
      }
    }
  }
  for (i = 0; i < g->states.n; i++) {
    s = g->states.v[i];
    if (s->reduces_to)
      if (d_verbose_level) printf("reduces_to %d %d\n", s->index, s->reduces_to->index);
  }
  FREE(eq);
}